

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_quadrature.hpp
# Opt level: O3

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_IntegratorXX::LebedevLaikov<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
            *r,Quadrature<IntegratorXX::LebedevLaikov<double>_> *a,point_type *cen)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  pointer pdVar10;
  long lVar11;
  long lVar12;
  tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_50;
  
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_IntegratorXX::LebedevLaikov<double>_>,_void>
  ::generate(&local_50,r,a);
  lVar7 = (long)(a->
                super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    pdVar2 = (r->
             super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (r->
             super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = (long)pdVar3 - (long)pdVar2 >> 3;
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    lVar11 = 0;
    pdVar10 = local_50.
              super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
              super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
              _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (pdVar3 != pdVar2) {
        lVar12 = 0;
        do {
          pdVar10[lVar12] = pdVar2[lVar12] * pdVar2[lVar12] * pdVar10[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar12);
      }
      lVar11 = lVar11 + 1;
      pdVar10 = pdVar10 + lVar9;
    } while (lVar11 != lVar7 + (ulong)(lVar7 == 0));
  }
  if ((long)local_50.
            super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
            .
            super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
            .
            super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    dVar4 = cen->_M_elems[0];
    dVar5 = cen->_M_elems[1];
    dVar1 = cen->_M_elems[2];
    lVar7 = ((long)local_50.
                   super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.
                   super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    pdVar8 = (local_50.
              super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              .
              super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 2;
    do {
      dVar6 = pdVar8[-1];
      ((array<double,_3UL> *)(pdVar8 + -2))->_M_elems[0] =
           ((array<double,_3UL> *)(pdVar8 + -2))->_M_elems[0] + dVar4;
      pdVar8[-1] = dVar6 + dVar5;
      *pdVar8 = *pdVar8 + dVar1;
      pdVar8 = pdVar8 + 3;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,
             &local_50.
              super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              .
              super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
              ._M_head_impl,(vector<double,_std::allocator<double>_> *)&local_50);
  if (local_50.
      super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
      .
      super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    .
                    super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.
      super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
      .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
      super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_50.
                    super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                    super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
                    _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                          ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                          ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( 
      const Quadrature<RadialQuad>&  r, 
      const Quadrature<AngularQuad>& a,
      const point_type&              cen
    ) {

    auto [points, weights] = prod_traits::generate(r, a); 

    const auto npr  = r.npts();
    const auto npa  = a.npts();

    const auto& rp = r.points();

    // Include Spherical Jacobian
    for( size_t j = 0; j < npa; ++j )
    for( size_t i = 0; i < npr; ++i ) {

      const auto ij = i + j * npr;
      weights[ij] *= rp[i] * rp[i];

    }

    // Recenter
    shift_grid( points, cen );

    return std::make_tuple( points, weights );

  }